

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepBtree *
absl::lts_20240722::cord_internal::CordRepBtree::ConsumeBeginTo
          (CordRepBtree *tree,size_t end,size_t new_length)

{
  CordRepBtree *pCVar1;
  CordRepBtree *old;
  Span<absl::lts_20240722::cord_internal::CordRep_*const> SVar2;
  Span<absl::lts_20240722::cord_internal::CordRep_*const> edges;
  
  if (end <= (tree->super_CordRep).storage[2]) {
    if ((tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
      SVar2 = Edges(tree,end,(ulong)(tree->super_CordRep).storage[2]);
      edges.len_ = (pointer)SVar2.len_;
      edges.ptr_ = edges.len_;
      Unref((CordRepBtree *)SVar2.ptr_,edges);
      (tree->super_CordRep).storage[2] = (uint8_t)end;
      (tree->super_CordRep).length = new_length;
      pCVar1 = tree;
    }
    else {
      pCVar1 = CopyBeginTo(tree,end,new_length);
      CordRep::Unref(&tree->super_CordRep);
    }
    return pCVar1;
  }
  __assert_fail("end <= tree->end()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x33c,
                "static CordRepBtree *absl::cord_internal::CordRepBtree::ConsumeBeginTo(CordRepBtree *, size_t, size_t)"
               );
}

Assistant:

inline CordRepBtree* Unwind(CordRepBtree* tree, int depth, size_t length,
                              OpResult result) {
    // TODO(mvels): revisit the below code to check if 3 loops with 3
    // (incremental) conditions is faster than 1 loop with a switch.
    // Benchmarking and perf recordings indicate the loop with switch is
    // fastest, likely because of indirect jumps on the tight case values and
    // dense branches. But it's worth considering 3 loops, as the `action`
    // transitions are mono directional. E.g.:
    //   while (action == kPopped) {
    //     ...
    //   }
    //   while (action == kCopied) {
    //     ...
    //   }
    //   ...
    // We also  found that an "if () do {}" loop here seems faster, possibly
    // because it allows the branch predictor more granular heuristics on
    // 'single leaf' (`depth` == 0) and 'single depth' (`depth` == 1) cases
    // which appear to be the most common use cases.
    if (depth != 0) {
      do {
        CordRepBtree* node = stack[--depth];
        const bool owned = depth < share_depth;
        switch (result.action) {
          case CordRepBtree::kPopped:
            assert(!propagate);
            result = node->AddEdge<edge_type>(owned, result.tree, length);
            break;
          case CordRepBtree::kCopied:
            result = node->SetEdge<edge_type>(owned, result.tree, length);
            if (propagate) stack[depth] = result.tree;
            break;
          case CordRepBtree::kSelf:
            node->length += length;
            while (depth > 0) {
              node = stack[--depth];
              node->length += length;
            }
            return node;
        }
      } while (depth > 0);
    }
    return Finalize(tree, result);
  }